

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<false> * __thiscall
TextState<false>::String
          (TextState<false> *this,Context<false> *ctx,char *str,SizeType length,bool param_5)

{
  char cVar1;
  uint in_ECX;
  char *in_RDX;
  long in_RSI;
  char *p;
  char *end;
  char *start;
  Namespace<false> *ns;
  undefined3 in_stack_00000028;
  char *local_40;
  char *local_30;
  
  Context<false>::CurrentNamespace((Context<false> *)0x2715da);
  local_30 = in_RDX;
  for (local_40 = in_RDX; local_40 != in_RDX + in_ECX; local_40 = local_40 + 1) {
    cVar1 = *local_40;
    if ((cVar1 == '\t') || (cVar1 == ' ')) {
      *local_40 = '\0';
      if (0 < (long)local_40 - (long)local_30) {
        Namespace<false>::AddFeature
                  ((Namespace<false> *)str,(vw *)CONCAT44(length,_in_stack_00000028),
                   &ns->feature_group);
      }
      local_30 = local_40 + 1;
    }
    else if ((cVar1 == ':') || (cVar1 == '|')) {
      *local_40 = '_';
    }
  }
  if (local_30 < in_RDX + in_ECX) {
    Namespace<false>::AddFeature
              ((Namespace<false> *)str,(vw *)CONCAT44(length,_in_stack_00000028),&ns->feature_group)
    ;
  }
  return *(BaseState<false> **)(in_RSI + 0x28);
}

Assistant:

BaseState<audit>* String(Context<audit>& ctx, const char* str, rapidjson::SizeType length, bool)
  {
    auto& ns = ctx.CurrentNamespace();

    // split into individual features
    const char* start = str;
    const char* end = str + length;
    for (char* p = (char*)str; p != end; p++)
    {
      switch (*p)
      {
          // split on space and tab
        case ' ':
        case '\t':
          *p = '\0';
          if (p - start > 0)
            ns.AddFeature(ctx.all, start);

          start = p + 1;
          break;
          // escape chars
        case ':':
        case '|':
          *p = '_';
          break;
      }
    }

    if (start < end)
      ns.AddFeature(ctx.all, start);

    return ctx.previous_state;
  }